

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9GenQbf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *pNew;
  char *pcVar3;
  Gia_Man_t *pTemp;
  uint local_48;
  int c;
  int fVerbose;
  int fUseOut;
  char *pStr;
  uint local_30;
  int nLutSize;
  int nLutNum;
  int nFrames;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  nLutSize = 1;
  local_30 = 1;
  pStr._4_4_ = 6;
  _fVerbose = (char *)0x0;
  c = 0;
  local_48 = 0;
  Extra_UtilGetoptReset();
LAB_002c0ab5:
  iVar1 = Extra_UtilGetopt(argc,argv,"FKNSovh");
  if (iVar1 == -1) {
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"There is no current GIA.\n");
      return 1;
    }
    iVar1 = Gia_ManRegNum(pAbc->pGia);
    if (iVar1 == 0) {
      Abc_Print(-1,"Works only for sequential networks.\n");
      return 1;
    }
    iVar1 = Gia_ManRegNum(pAbc->pGia);
    if (iVar1 < (int)(pStr._4_4_ * local_30)) {
      uVar2 = Gia_ManRegNum(pAbc->pGia);
      Abc_Print(-1,"The number of flops (%d) is less than required (%d).\n",(ulong)uVar2,
                (ulong)(pStr._4_4_ * local_30));
      return 1;
    }
    if ((nLutSize == 1) && (local_30 == 1)) {
      pNew = Gia_GenQbfMiter(pAbc->pGia,1,1,pStr._4_4_,_fVerbose,c,local_48);
      Abc_FrameUpdateGia(pAbc,pNew);
      if (_fVerbose != (char *)0x0) {
        free(_fVerbose);
      }
      return 0;
    }
    Abc_Print(-1,"Currently this commands works for one frame and one LUT.\n");
    return 1;
  }
  switch(iVar1) {
  case 0x46:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
      goto LAB_002c0df4;
    }
    nLutSize = atoi(argv[globalUtilOptind]);
    uVar2 = nLutSize;
    break;
  default:
    goto LAB_002c0df4;
  case 0x4b:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
      goto LAB_002c0df4;
    }
    pStr._4_4_ = atoi(argv[globalUtilOptind]);
    uVar2 = pStr._4_4_;
    break;
  case 0x4e:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
      goto LAB_002c0df4;
    }
    local_30 = atoi(argv[globalUtilOptind]);
    uVar2 = local_30;
    break;
  case 0x53:
    if (globalUtilOptind < argc) goto LAB_002c0c52;
    Abc_Print(-1,"Command line switch \"-S\" should be followed by a string.\n");
    goto LAB_002c0df4;
  case 0x68:
    goto LAB_002c0df4;
  case 0x6f:
    c = c ^ 1;
    goto LAB_002c0ab5;
  case 0x76:
    local_48 = local_48 ^ 1;
    goto LAB_002c0ab5;
  }
  globalUtilOptind = globalUtilOptind + 1;
  if ((int)uVar2 < 0) goto LAB_002c0df4;
  goto LAB_002c0ab5;
LAB_002c0c52:
  _fVerbose = Abc_UtilStrsav(argv[globalUtilOptind]);
  globalUtilOptind = globalUtilOptind + 1;
  if (_fVerbose == (char *)0x0) {
LAB_002c0df4:
    Abc_Print(-2,"usage: &genqbf [-FKN num] [-ovh]\n");
    Abc_Print(-2,"\t         generates QBF miter for computing an inductive invariant\n");
    Abc_Print(-2,"\t-F num : the number of time frames for induction [default = %d]\n",
              (ulong)(uint)nLutSize);
    Abc_Print(-2,"\t-K num : the LUT size [default = %d]\n",(ulong)pStr._4_4_);
    Abc_Print(-2,"\t-N num : the number of LUTs [default = %d]\n",(ulong)local_30);
    pcVar3 = "no";
    if (c != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-o     : toggle using the last output [default = %s]\n",pcVar3);
    pcVar3 = "no";
    if (local_48 != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    return 1;
  }
  goto LAB_002c0ab5;
}

Assistant:

int Abc_CommandAbc9GenQbf( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_GenQbfMiter( Gia_Man_t * pGia, int nFrames, int nLutNum, int nLutSize, char * pStr, int fUseOut, int fVerbose );
    int nFrames   =    1;
    int nLutNum   =    1;
    int nLutSize  =    6;
    char * pStr   = NULL;
    int fUseOut   =    0;
    int fVerbose  =    0;
    int c;
    Gia_Man_t * pTemp;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FKNSovh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutNum < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a string.\n" );
                goto usage;
            }
            pStr = Abc_UtilStrsav(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pStr == NULL )
                goto usage;
            break;
        case 'o':
            fUseOut ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "There is no current GIA.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Works only for sequential networks.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) < nLutSize * nLutNum )
    {
        Abc_Print( -1, "The number of flops (%d) is less than required (%d).\n", Gia_ManRegNum(pAbc->pGia), nLutSize * nLutNum );
        return 1;
    }
    if ( nFrames != 1 || nLutNum != 1 )
    {
        Abc_Print( -1, "Currently this commands works for one frame and one LUT.\n" );
        return 1;
    }
    pTemp = Gia_GenQbfMiter( pAbc->pGia, nFrames, nLutNum, nLutSize, pStr, fUseOut, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    ABC_FREE( pStr );
    return 0;

usage:
    Abc_Print( -2, "usage: &genqbf [-FKN num] [-ovh]\n" );
    Abc_Print( -2, "\t         generates QBF miter for computing an inductive invariant\n" );
    Abc_Print( -2, "\t-F num : the number of time frames for induction [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-K num : the LUT size [default = %d]\n", nLutSize );
    Abc_Print( -2, "\t-N num : the number of LUTs [default = %d]\n", nLutNum );
    Abc_Print( -2, "\t-o     : toggle using the last output [default = %s]\n", fUseOut? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}